

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O0

int __thiscall
deqp::BlockSingleNestedStructArrayCase::init
          (BlockSingleNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  StructType *pSVar1;
  UniformBlock *pUVar2;
  BlockSingleNestedStructArrayCase *extraout_RAX;
  VarType local_258;
  Uniform local_240;
  VarType local_200;
  VarType local_1e8;
  Uniform local_1d0;
  VarType local_190;
  Uniform local_178;
  VarType local_138;
  Uniform local_120;
  UniformBlock *local_e0;
  UniformBlock *block;
  VarType local_c0;
  VarType local_a8;
  StructType *local_90;
  StructType *typeT;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockSingleNestedStructArrayCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = ub::ShaderInterface::allocStruct(&(this->super_UniformBlockCase).m_interface,"S");
  local_18 = pSVar1;
  ub::VarType::VarType(&local_30,TYPE_INT_VEC3,4);
  ub::StructType::addMember(pSVar1,"a",&local_30,0);
  ub::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  ub::VarType::VarType(&local_70,TYPE_INT_VEC2,2);
  ub::VarType::VarType(&local_58,&local_70,4);
  ub::StructType::addMember(pSVar1,"b",&local_58,0);
  ub::VarType::~VarType(&local_58);
  ub::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  ub::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,4);
  ub::StructType::addMember(pSVar1,"c",(VarType *)&typeT,0xc00);
  ub::VarType::~VarType((VarType *)&typeT);
  pSVar1 = ub::ShaderInterface::allocStruct(&(this->super_UniformBlockCase).m_interface,"T");
  local_90 = pSVar1;
  ub::VarType::VarType(&local_a8,TYPE_FLOAT_MAT3,2);
  ub::StructType::addMember(pSVar1,"a",&local_a8,0);
  ub::VarType::~VarType(&local_a8);
  pSVar1 = local_90;
  ub::VarType::VarType((VarType *)&block,local_18);
  ub::VarType::VarType(&local_c0,(VarType *)&block,3);
  ub::StructType::addMember(pSVar1,"b",&local_c0,0);
  ub::VarType::~VarType(&local_c0);
  ub::VarType::~VarType((VarType *)&block);
  pUVar2 = ub::ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,"Block");
  local_e0 = pUVar2;
  ub::VarType::VarType(&local_138,local_18);
  ub::Uniform::Uniform(&local_120,"s",&local_138,0);
  ub::UniformBlock::addUniform(pUVar2,&local_120);
  ub::Uniform::~Uniform(&local_120);
  ub::VarType::~VarType(&local_138);
  pUVar2 = local_e0;
  ub::VarType::VarType(&local_190,TYPE_FLOAT_VEC2,1);
  ub::Uniform::Uniform(&local_178,"v",&local_190,0xc00);
  ub::UniformBlock::addUniform(pUVar2,&local_178);
  ub::Uniform::~Uniform(&local_178);
  ub::VarType::~VarType(&local_190);
  pUVar2 = local_e0;
  ub::VarType::VarType(&local_200,local_90);
  ub::VarType::VarType(&local_1e8,&local_200,2);
  ub::Uniform::Uniform(&local_1d0,"t",&local_1e8,0);
  ub::UniformBlock::addUniform(pUVar2,&local_1d0);
  ub::Uniform::~Uniform(&local_1d0);
  ub::VarType::~VarType(&local_1e8);
  ub::VarType::~VarType(&local_200);
  pUVar2 = local_e0;
  ub::VarType::VarType(&local_258,TYPE_UINT,4);
  ub::Uniform::Uniform(&local_240,"u",&local_258,0);
  ub::UniformBlock::addUniform(pUVar2,&local_240);
  ub::Uniform::~Uniform(&local_240);
  ub::VarType::~VarType(&local_258);
  ub::UniformBlock::setFlags(local_e0,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    ub::UniformBlock::setInstanceName(local_e0,"block");
    ub::UniformBlock::setArraySize(local_e0,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init(void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(VarType(&typeS), 3));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(VarType(&typeT), 2), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}